

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O0

unsigned_short __thiscall
IDisk::GetTrackInfoForRev(IDisk *this,int side,int track,Track *track_buffer,int rev)

{
  byte bVar1;
  bool bVar2;
  undefined8 uVar3;
  uchar uVar4;
  uchar uVar5;
  byte bVar6;
  unsigned_short uVar7;
  int iVar8;
  size_type sVar9;
  reference pvVar10;
  bool bVar11;
  bool bVar12;
  uint local_154;
  uint local_150;
  uint i_4;
  int offset_end;
  int gap_3_total;
  int iStack_140;
  uchar b_1;
  int readoffset_1;
  int i_3;
  int iStack_134;
  uchar b;
  int readoffset;
  int i_2;
  uchar return_value;
  int data_count;
  int sizeMaxSector;
  ushort uStack_11a;
  uchar byte;
  int i_1;
  bool data_ok;
  bool data_found;
  unsigned_short crc;
  Sector sector;
  int local_e0;
  int i;
  bool sync_ok;
  char pattern_f [56];
  undefined1 local_98 [8];
  char pattern_fe [64];
  undefined1 local_50 [4];
  uint index;
  CRC crc_local;
  unsigned_short size;
  int rev_local;
  Track *track_buffer_local;
  int track_local;
  int side_local;
  IDisk *this_local;
  
  crc_local.crc_stack_.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = rev;
  CRC::CRC((CRC *)local_50);
  crc_local.crc_stack_.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._2_2_ = 0x100;
  pattern_fe[0x3c] = '\0';
  pattern_fe[0x3d] = '\0';
  pattern_fe[0x3e] = '\0';
  pattern_fe[0x3f] = '\0';
  memcpy(local_98,&DAT_001fce80,0x40);
  memcpy(&i,&DAT_001fcec0,0x38);
  while ((uint)pattern_fe._60_4_ <
         this->side_[side].tracks[track].revolution
         [crc_local.crc_stack_.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_].size - 0x40) {
    bVar11 = 0x80 < (uint)pattern_fe._60_4_;
    if (bVar11) {
      iVar8 = memcmp(local_98,this->side_[side].tracks[track].revolution
                              [crc_local.crc_stack_.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_].bitfield +
                              (uint)pattern_fe._60_4_,0x40);
      bVar11 = iVar8 == 0;
      if (bVar11) {
        local_e0 = 0;
        while( true ) {
          bVar12 = false;
          if (local_e0 < 0x28) {
            bVar12 = bVar11;
          }
          if (!bVar12) break;
          if ((this->side_[side].tracks[track].revolution
               [crc_local.crc_stack_.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_].bitfield
               [(uint)(pattern_fe._60_4_ + -0x50 + local_e0 * 2)] != '\x01') ||
             (this->side_[side].tracks[track].revolution
              [crc_local.crc_stack_.
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_].bitfield
              [(pattern_fe._60_4_ + local_e0 * 2) - 0x4f] != '\0')) {
            bVar11 = false;
          }
          local_e0 = local_e0 + 1;
        }
      }
    }
    if (bVar11) {
      CRC::Reset((CRC *)local_50);
      CRC::AddByteToCrc((CRC *)local_50,0xa1);
      CRC::AddByteToCrc((CRC *)local_50,0xa1);
      CRC::AddByteToCrc((CRC *)local_50,0xa1);
      CRC::AddByteToCrc((CRC *)local_50,0xfe);
      sector.c = '\0';
      sector.h = '\0';
      sector.r = '\0';
      sector.n = '\0';
      sector.chrn_crc_ok = false;
      sector.status1 = '\0';
      sector.status2 = '\0';
      sector._15_1_ = 0;
      sector.real_size = 0;
      sector._18_2_ = 0;
      sector.dam_offset = 0;
      sector.idam_offset = 0;
      sector.idam_sync_offset = 0;
      sector.dam_sync_offset = 0;
      _data_ok = pattern_fe._60_4_ - 0x50;
      i_1._0_1_ = pattern_fe[0x3c];
      i_1._1_1_ = pattern_fe[0x3d];
      i_1._2_1_ = pattern_fe[0x3e];
      i_1._3_1_ = pattern_fe[0x3f];
      pattern_fe._60_4_ = pattern_fe._60_4_ + 0x40;
      uVar4 = GetNextByteForRev(this,side,track,pattern_fe._60_4_,
                                crc_local.crc_stack_.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      sector.idam_offset._0_1_ = uVar4;
      CRC::AddByteToCrc((CRC *)local_50,uVar4);
      pattern_fe._60_4_ = pattern_fe._60_4_ + 0x10;
      uVar4 = GetNextByteForRev(this,side,track,pattern_fe._60_4_,
                                crc_local.crc_stack_.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      sector.idam_offset._1_1_ = uVar4;
      CRC::AddByteToCrc((CRC *)local_50,uVar4);
      pattern_fe._60_4_ = pattern_fe._60_4_ + 0x10;
      uVar4 = GetNextByteForRev(this,side,track,pattern_fe._60_4_,
                                crc_local.crc_stack_.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      sector.idam_offset._2_1_ = uVar4;
      CRC::AddByteToCrc((CRC *)local_50,uVar4);
      pattern_fe._60_4_ = pattern_fe._60_4_ + 0x10;
      uVar4 = GetNextByteForRev(this,side,track,pattern_fe._60_4_,
                                crc_local.crc_stack_.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      sector.idam_offset._3_1_ = uVar4;
      CRC::AddByteToCrc((CRC *)local_50,uVar4);
      pattern_fe._60_4_ = pattern_fe._60_4_ + 0x10;
      if (this->log_ != (ILog *)0x0) {
        (*(code *)**(undefined8 **)this->log_)(this->log_,"Track : ");
      }
      if (this->log_ != (ILog *)0x0) {
        track_buffer_local._0_1_ = (undefined1)track;
        (**(code **)(*(long *)this->log_ + 8))(this->log_,track_buffer_local._0_1_);
      }
      if (this->log_ != (ILog *)0x0) {
        (*(code *)**(undefined8 **)this->log_)(this->log_," - REV :");
      }
      if (this->log_ != (ILog *)0x0) {
        (**(code **)(*(long *)this->log_ + 8))
                  (this->log_,
                   crc_local.crc_stack_.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_1_);
      }
      if (this->log_ != (ILog *)0x0) {
        (*(code *)**(undefined8 **)this->log_)(this->log_," -> CHRN Found");
      }
      if (this->log_ != (ILog *)0x0) {
        (**(code **)(*(long *)this->log_ + 8))(this->log_,sector._0_8_ & 0xff);
      }
      if (this->log_ != (ILog *)0x0) {
        (**(code **)(*(long *)this->log_ + 8))(this->log_,sector.idam_offset._1_1_);
      }
      if (this->log_ != (ILog *)0x0) {
        (**(code **)(*(long *)this->log_ + 8))(this->log_,sector.idam_offset._2_1_);
      }
      if (this->log_ != (ILog *)0x0) {
        (**(code **)(*(long *)this->log_ + 8))(this->log_,sector.idam_offset._3_1_);
      }
      uVar4 = GetNextByteForRev(this,side,track,pattern_fe._60_4_,
                                crc_local.crc_stack_.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      pattern_fe._60_4_ = pattern_fe._60_4_ + 0x10;
      uVar5 = GetNextByteForRev(this,side,track,pattern_fe._60_4_,
                                crc_local.crc_stack_.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      pattern_fe._60_4_ = pattern_fe._60_4_ + 0x10;
      uVar7 = CRC::GetCRC((CRC *)local_50);
      uVar3 = sector._0_8_;
      if (CONCAT11(uVar4,uVar5) == uVar7) {
        sector.idam_sync_offset._0_1_ = 1;
      }
      else {
        sector._0_5_ = CONCAT14(0,sector.idam_offset);
        sector.idam_sync_offset._1_1_ = SUB81(uVar3,5);
        sector.idam_sync_offset._2_2_ = SUB82(uVar3,6);
        sector._0_8_ = CONCAT26(sector.idam_sync_offset._2_2_,
                                CONCAT15(sector.idam_sync_offset._1_1_,sector._0_5_)) |
                       0x200000000000;
        if (this->log_ != (ILog *)0x0) {
          (*(code *)**(undefined8 **)this->log_)(this->log_,"HEADER CRC ERROR !");
        }
      }
      if (this->log_ != (ILog *)0x0) {
        (**(code **)(*(long *)this->log_ + 0x20))();
      }
      bVar1 = 0;
      while( true ) {
        bVar12 = false;
        if ((uint)pattern_fe._60_4_ <
            this->side_[side].tracks[track].revolution
            [crc_local.crc_stack_.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_].size - 0x38) {
          bVar12 = (bool)(bVar1 ^ 1);
        }
        if (!bVar12) break;
        iVar8 = memcmp(local_98,this->side_[side].tracks[track].revolution
                                [crc_local.crc_stack_.
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_].bitfield
                                + (uint)pattern_fe._60_4_,0x38);
        bVar12 = iVar8 == 0;
        if (bVar12) {
          sizeMaxSector = 0;
          while( true ) {
            bVar2 = false;
            if (sizeMaxSector < 0x28) {
              bVar2 = bVar11;
            }
            if (!bVar2) break;
            if ((this->side_[side].tracks[track].revolution
                 [crc_local.crc_stack_.
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_].bitfield
                 [(uint)(pattern_fe._60_4_ + -0x50 + sizeMaxSector * 2)] != '\x01') ||
               (this->side_[side].tracks[track].revolution
                [crc_local.crc_stack_.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_].bitfield
                [(pattern_fe._60_4_ + sizeMaxSector * 2) - 0x4f] != '\0')) {
              bVar12 = false;
            }
            sizeMaxSector = sizeMaxSector + 1;
          }
        }
        if (bVar12) {
          bVar1 = 1;
          sector.chrn_crc_ok = (bool)pattern_fe[0x3c];
          sector.status1 = pattern_fe[0x3d];
          sector.status2 = pattern_fe[0x3e];
          sector._15_1_ = pattern_fe[0x3f];
          sector._16_4_ = pattern_fe._60_4_ + -0x50;
          pattern_fe._60_4_ = pattern_fe._60_4_ + 0x30;
          CRC::Reset((CRC *)local_50);
          CRC::AddByteToCrc((CRC *)local_50,0xa1);
          CRC::AddByteToCrc((CRC *)local_50,0xa1);
          CRC::AddByteToCrc((CRC *)local_50,0xa1);
          uVar4 = GetNextByteForRev(this,side,track,pattern_fe._60_4_,
                                    crc_local.crc_stack_.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          CRC::AddByteToCrc((CRC *)local_50,uVar4);
          if (this->log_ != (ILog *)0x0) {
            (*(code *)**(undefined8 **)this->log_)(this->log_," DATA FOUND : A1A1A1-");
          }
          if (this->log_ != (ILog *)0x0) {
            (**(code **)(*(long *)this->log_ + 8))(this->log_,uVar4);
          }
          if (this->log_ != (ILog *)0x0) {
            (**(code **)(*(long *)this->log_ + 0x20))();
          }
          pattern_fe._60_4_ = pattern_fe._60_4_ + 0x10;
          if (uVar4 == 0xf8) {
            sector._0_8_ = sector._0_8_ | 0x40000000000000;
          }
          bVar6 = sector.idam_offset._3_1_ & 7;
          for (i_2 = 0; i_2 < 0x80 << bVar6; i_2 = i_2 + 1) {
            if (pattern_fe._60_4_ + 0x10 <
                this->side_[side].tracks[track].revolution
                [crc_local.crc_stack_.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_].size) {
              uVar4 = GetNextByteForRev(this,side,track,pattern_fe._60_4_,
                                        crc_local.crc_stack_.
                                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
              CRC::AddByteToCrc((CRC *)local_50,uVar4);
              sector._8_2_ = sector._8_2_ + 1;
              pattern_fe._60_4_ = pattern_fe._60_4_ + 0x10;
            }
            else {
              readoffset._3_1_ = 0;
              for (iStack_134 = 0; iStack_134 < 0x10; iStack_134 = iStack_134 + 2) {
                if ((uint)pattern_fe._60_4_ <
                    this->side_[side].tracks[track].revolution
                    [crc_local.crc_stack_.
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_].size) {
                  i_3._0_1_ = pattern_fe[0x3c];
                  i_3._1_1_ = pattern_fe[0x3d];
                  i_3._2_1_ = pattern_fe[0x3e];
                  i_3._3_1_ = pattern_fe[0x3f];
                }
                else {
                  i_3 = (uint)pattern_fe._60_4_ %
                        this->side_[side].tracks[track].revolution
                        [crc_local.crc_stack_.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage._4_4_].size;
                }
                pattern_fe._60_4_ = pattern_fe._60_4_ + 2;
                readoffset._3_1_ =
                     readoffset._3_1_ << 1 |
                     this->side_[side].tracks[track].revolution
                     [crc_local.crc_stack_.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_].bitfield[i_3] & 1;
              }
              CRC::AddByteToCrc((CRC *)local_50,readoffset._3_1_);
              sector._8_2_ = sector._8_2_ + 1;
            }
          }
          if ((uint)pattern_fe._60_4_ <
              this->side_[side].tracks[track].revolution
              [crc_local.crc_stack_.
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_].size - 0x20) {
            uVar4 = GetNextByteForRev(this,side,track,pattern_fe._60_4_,
                                      crc_local.crc_stack_.
                                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
            pattern_fe._60_4_ = pattern_fe._60_4_ + 0x10;
            uVar5 = GetNextByteForRev(this,side,track,pattern_fe._60_4_,
                                      crc_local.crc_stack_.
                                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
            uStack_11a = CONCAT11(uVar4,uVar5);
            pattern_fe._60_4_ = pattern_fe._60_4_ + 0x10;
          }
          else {
            uStack_11a = 0;
            for (iStack_140 = 0; iStack_140 < 0x20; iStack_140 = iStack_140 + 2) {
              if ((uint)pattern_fe._60_4_ <
                  this->side_[side].tracks[track].revolution
                  [crc_local.crc_stack_.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_].size) {
                gap_3_total._0_1_ = pattern_fe[0x3c];
                gap_3_total._1_1_ = pattern_fe[0x3d];
                gap_3_total._2_1_ = pattern_fe[0x3e];
                gap_3_total._3_1_ = pattern_fe[0x3f];
              }
              else {
                gap_3_total = (uint)pattern_fe._60_4_ %
                              this->side_[side].tracks[track].revolution
                              [crc_local.crc_stack_.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_].size;
              }
              pattern_fe._60_4_ = pattern_fe._60_4_ + 2;
              uStack_11a = uStack_11a << 1 |
                           this->side_[side].tracks[track].revolution
                           [crc_local.crc_stack_.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_].bitfield
                           [gap_3_total] & 1;
            }
            if (this->log_ != (ILog *)0x0) {
              (*(code *)**(undefined8 **)this->log_)(this->log_,"Track size is too small ?!!");
            }
          }
          uVar7 = CRC::GetCRC((CRC *)local_50);
          if (uStack_11a == uVar7) {
            sector.dam_offset._0_1_ = 1;
          }
          else {
            sector.dam_offset._0_1_ = 0;
            sector._0_8_ = sector._0_8_ | 0x20200000000000;
            if (this->log_ != (ILog *)0x0) {
              (*(code *)**(undefined8 **)this->log_)(this->log_,"DATA CRC ERROR !");
            }
          }
          if (this->log_ != (ILog *)0x0) {
            (**(code **)(*(long *)this->log_ + 0x20))();
          }
          sector.dam_sync_offset._0_1_ = pattern_fe[0x3c];
          sector.dam_sync_offset._1_1_ = pattern_fe[0x3d];
          sector.dam_sync_offset._2_1_ = pattern_fe[0x3e];
          sector.dam_sync_offset._3_1_ = pattern_fe[0x3f];
          if ((((uint)pattern_fe._60_4_ <
                this->side_[side].tracks[track].revolution
                [crc_local.crc_stack_.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_].size - 0x10) &&
              (uVar4 = GetNextByteForRev(this,side,track,pattern_fe._60_4_,
                                         crc_local.crc_stack_.
                                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_),
              uVar4 != 'N')) && (uVar4 != 'K')) {
            sector._8_2_ = sector._8_2_ + 2;
            while( true ) {
              iVar8 = memcmp(local_98,this->side_[side].tracks[track].revolution
                                      [crc_local.crc_stack_.
                                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_].
                                      bitfield + (uint)pattern_fe._60_4_,0x38);
              bVar12 = false;
              if (iVar8 != 0) {
                bVar12 = (uint)pattern_fe._60_4_ <
                         this->side_[side].tracks[track].revolution
                         [crc_local.crc_stack_.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_].size - 0x38;
              }
              if (!bVar12) break;
              pattern_fe._60_4_ = pattern_fe._60_4_ + 0x10;
              sector._8_2_ = sector._8_2_ + 1;
            }
          }
          std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::push_back
                    (&track_buffer->list_sector_,(value_type *)&i_1);
          crc_local.crc_stack_.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._2_2_ =
               crc_local.crc_stack_.
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._2_2_ + sector._8_2_;
          pattern_fe._60_4_ = i_1 + 0x41;
        }
        else {
          pattern_fe._60_4_ = pattern_fe._60_4_ + 1;
        }
      }
    }
    else {
      pattern_fe._60_4_ = pattern_fe._60_4_ + 1;
    }
  }
  i_4 = 0;
  local_150 = 0;
  sVar9 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::size
                    (&track_buffer->list_sector_);
  if (sVar9 == 0) {
    track_buffer->full_size_ = 0;
  }
  else {
    for (local_154 = 0;
        sVar9 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::size
                          (&track_buffer->list_sector_), local_154 < sVar9;
        local_154 = local_154 + 1) {
      if (local_154 != 0) {
        pvVar10 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                            (&track_buffer->list_sector_,(ulong)local_154);
        i_4 = ((pvVar10->idam_offset - 0x18) - local_150) + i_4;
      }
      pvVar10 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::operator[]
                          (&track_buffer->list_sector_,(ulong)local_154);
      local_150 = pvVar10->index_end;
    }
    sVar9 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::size
                      (&track_buffer->list_sector_);
    track_buffer->gap3_size_ = (int)((ulong)(long)((int)i_4 / 0x10) / sVar9);
    if ((crc_local.crc_stack_.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._2_2_ & 0xff00) <
        crc_local.crc_stack_.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._2_2_) {
      crc_local.crc_stack_.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._2_2_ =
           crc_local.crc_stack_.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._2_2_ + 0x100;
    }
    track_buffer->full_size_ =
         (uint)crc_local.crc_stack_.
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._2_2_;
  }
  uVar7 = crc_local.crc_stack_.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._2_2_;
  CRC::~CRC((CRC *)local_50);
  return uVar7;
}

Assistant:

unsigned short IDisk::GetTrackInfoForRev(int side, int track, Track* track_buffer, int rev)
{
   unsigned short size;
   CRC crc_local;
   // Compute size of track :
   // Header
   size = 256;

   unsigned int index = 0;
   // States :
   // 0 - waiting for next sector id
   // 1 - waiting for next sector data
   // 2 - waiting for end of datas

   // A1 = 4489, FE =
   const char pattern_fe[] = {
      0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 0, 0, 1,
      0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1, 0, 0
   };
   const char pattern_f[] = {
      0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 0, 0, 1,
      0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1
   };

   while (index < side_[side].tracks[track].revolution[rev].size - (int)sizeof(pattern_fe))
   {
      // Test the pervious 8 bytes (should be '00')
      bool sync_ok = (index > 8 * 16);

      if (sync_ok)
      {
         sync_ok = (memcmp(pattern_fe, &side_[side].tracks[track].revolution[rev].bitfield[index],
                           sizeof(pattern_fe)) == 0);
         if (sync_ok)
         {
            for (int i = 0; i < SYNC_BIT_NUMBER && sync_ok; i++)
            {
               if (side_[side].tracks[track].revolution[rev].bitfield[index - SYNC_BIT_NUMBER * 2 + i * 2] != 1
                  || side_[side].tracks[track].revolution[rev].bitfield[index - SYNC_BIT_NUMBER * 2 + i * 2 + 1] != 0)
               {
                  sync_ok = false;
               }
            }
         }
      }
      if (sync_ok)
      {
         // Found ! New sector
         crc_local.Reset();
         crc_local.AddByteToCrc(0xA1);
         crc_local.AddByteToCrc(0xA1);
         crc_local.AddByteToCrc(0xA1);
         crc_local.AddByteToCrc(0xFE);

         Sector sector;
         memset(&sector, 0, sizeof(sector));
         // Keep the offset position !
         sector.idam_offset = index;
         sector.idam_sync_offset = index - SYNC_BIT_NUMBER * 2;

         // Adding CHRN to the next sector
         index += sizeof(pattern_fe);

         sector.c = GetNextByteForRev(side, track, index, rev);
         crc_local.AddByteToCrc(sector.c);
         index += 16;
         sector.h = GetNextByteForRev(side, track, index, rev);
         crc_local.AddByteToCrc(sector.h);
         index += 16;
         sector.r = GetNextByteForRev(side, track, index, rev);
         crc_local.AddByteToCrc(sector.r);
         index += 16;
         sector.n = GetNextByteForRev(side, track, index, rev);
         crc_local.AddByteToCrc(sector.n);
         index += 16;

         LOG("Track : ");
         LOGB(track);
         LOG(" - REV :");
         LOGB(rev);
         LOG(" -> CHRN Found");
         LOGB(sector.c);
         LOGB(sector.h);
         LOGB(sector.r);
         LOGB(sector.n);

         // Do we have CRC error ?
         unsigned short crc = GetNextByteForRev(side, track, index, rev);
         crc <<= 8;
         index += 16;
         crc |= GetNextByteForRev(side, track, index, rev);
         index += 16;

         // Set status 1
         if (crc != crc_local.GetCRC())
         {
            sector.chrn_crc_ok = false;
            sector.status1 |= 0x20;
            LOG("HEADER CRC ERROR !");
         }
         else
         {
            sector.chrn_crc_ok = true;
         }
         LOGEOL
         // Now, waiting for A1A1A1F8/B
         bool data_found = false;
         while ((index < side_[side].tracks[track].revolution[rev].size - (int)sizeof(pattern_f)) && (!data_found))
         {
            bool data_ok = (memcmp(pattern_fe, &side_[side].tracks[track].revolution[rev].bitfield[index],
                                   sizeof(pattern_f)) == 0);

            if (data_ok)
            {
               for (int i = 0; i < SYNC_BIT_NUMBER && sync_ok; i++)
               {
                  if (side_[side].tracks[track].revolution[rev].bitfield[index - SYNC_BIT_NUMBER * 2 + i * 2] != 1
                     || side_[side].tracks[track].revolution[rev].bitfield[index - SYNC_BIT_NUMBER * 2 + i * 2 + 1] != 0
                  )
                  {
                     data_ok = false;
                  }
               }
            }

            if (data_ok)
            {
               data_found = true;
               // Keep the offset position
               sector.dam_offset = index;
               sector.dam_sync_offset = index - SYNC_BIT_NUMBER * 2;

               // Yeah
               index += sizeof(pattern_f) - 8;

               // Set the Status according to the F8/FB
               crc_local.Reset();
               crc_local.AddByteToCrc(0xA1);
               crc_local.AddByteToCrc(0xA1);
               crc_local.AddByteToCrc(0xA1);
               unsigned char byte = GetNextByteForRev(side, track, index, rev);
               crc_local.AddByteToCrc(byte);
               LOG(" DATA FOUND : A1A1A1-");
               LOGB(byte);
               LOGEOL

               index += 16;

               if (byte == 0xF8) // Erased
               {
                  sector.status2 |= 0x40;
               }

               // Now, gather datas...
               int sizeMaxSector = (sector.n & 0x7);
               for (int data_count = 0; data_count < (0x80 << sizeMaxSector); data_count++)
               {
                  if (index + 16 < side_[side].tracks[track].revolution[rev].size)
                  {
                     byte = GetNextByteForRev(side, track, index, rev);
                     crc_local.AddByteToCrc(byte);
                     sector.real_size++;
                     index += 16;
                  }
                  else
                  {
                     // Go through the index hole
                     unsigned char return_value = 0;

                     for (int i = 0; i < 16; i += 2)
                     {
                        int readoffset;
                        return_value <<= 1;
                        if (index >= side_[side].tracks[track].revolution[rev].size)
                        {
                           readoffset = index % side_[side].tracks[track].revolution[rev].size;
                        }
                        else
                        {
                           readoffset = index;
                        }
                        unsigned char b = side_[side].tracks[track].revolution[rev].bitfield[readoffset];
                        index += 2;
                        return_value |= b & 0x1;
                     }
                     crc_local.AddByteToCrc(return_value);
                     sector.real_size++;
                     //index = readoffset;
                  }
               }
               if (index < side_[side].tracks[track].revolution[rev].size - 32)
               {
                  // CRC Check
                  crc = GetNextByteForRev(side, track, index, rev);
                  crc <<= 8;
                  index += 16;
                  crc |= GetNextByteForRev(side, track, index, rev);
                  index += 16;
               }
               else
               {
                  crc = 0;

                  for (int i = 0; i < 32; i += 2)
                  {
                     int readoffset;
                     crc <<= 1;
                     if (index >= side_[side].tracks[track].revolution[rev].size)
                     {
                        readoffset = index % side_[side].tracks[track].revolution[rev].size;
                     }
                     else
                     {
                        readoffset = index;
                     }
                     unsigned char b = side_[side].tracks[track].revolution[rev].bitfield[readoffset];
                     index += 2;
                     crc |= b & 0x1;
                  }

                  //
                  LOG("Track size is too small ?!!");
               }
               // Set status 1
               if (crc != crc_local.GetCRC())
               {
                  sector.data_crc_ok = false;
                  sector.status1 |= 0x20;
                  sector.status2 |= 0x20;
                  LOG("DATA CRC ERROR !");
               }
               else
               {
                  sector.data_crc_ok = true;
               }
               LOGEOL
               // Keep this to compute GAP3 size
               sector.index_end = index;

               if (index < side_[side].tracks[track].revolution[rev].size - 16)
               {
                  // End of sector. Look at the GAP until Sync is found - Only get it if different from 0x4E
                  byte = GetNextByteForRev(side, track, index, rev);
                  if (byte != 0x4E && byte != 0x4B)
                  {
                     sector.real_size += 2; // Add CRC + first gap

                     while ((memcmp(pattern_fe, &side_[side].tracks[track].revolution[rev].bitfield[index],
                                    sizeof(pattern_f)) != 0)
                        && (index < side_[side].tracks[track].revolution[rev].size - (int)sizeof(pattern_f)))
                     {
                        index += 16;
                        ++sector.real_size;
                        /*byte = GetNextByteForRev (side, track, index );
                        index += 16;*/
                     }
                  }
               }

               // NOTE : It can be a bit misalign, so sync bytes are watched on a bit basis
               // TODO

               track_buffer->list_sector_.push_back(sector);

               size += sector.real_size;

               // Adaptation: rewind to sector.DAMOffset to avoid forgetting interlaced sectors
               //index = sector.DAMOffset + 64 + 1;
               index = sector.idam_offset + 64 + 1;
            }
            else
            {
               ++index;
            }
         }

         // Next sector
      }
      else
      {
         ++index;
      }
   }

   // Avegare GAP3 size :
   int gap_3_total = 0;
   int offset_end = 0;
   if (track_buffer->list_sector_.size() > 0)
   {
      for (unsigned int i = 0; i < track_buffer->list_sector_.size(); i++)
      {
         if (i > 0)
         {
            gap_3_total += track_buffer->list_sector_[i].idam_offset - 24 - offset_end;
         }
         offset_end = track_buffer->list_sector_[i].index_end;
      }
      //gap_3_total += side_[side].Tracks[track].Revolution[0].Size - offset_end;

      track_buffer->gap3_size_ = gap_3_total / 16 / track_buffer->list_sector_.size();

      if ((size & 0xFFFFFF00) < size)
      {
         size += 0x100;
      }
      track_buffer->full_size_ = size;
   }
   else
   {
      track_buffer->full_size_ = 0;
   }


   // TODO : Compute real size of track
   return size;
}